

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
InlinedVector(InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
              *this,size_t count,Point3<float> *value,
             polymorphic_allocator<pbrt::Point3<float>_> *alloc)

{
  iterator pPVar1;
  undefined8 *in_RCX;
  Point3<float> *in_RDX;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  *in_RSI;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  *in_RDI;
  size_t i;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  *local_28;
  
  (in_RDI->alloc).memoryResource = (memory_resource *)*in_RCX;
  in_RDI->ptr = (Point3<float> *)0x0;
  in_RDI->nAlloc = 0;
  in_RDI->nStored = 0;
  reserve(in_RSI,(size_t)in_RDX);
  for (local_28 = (InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                   *)0x0; local_28 < in_RSI;
      local_28 = (InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)((long)&(local_28->alloc).memoryResource + 1)) {
    pPVar1 = begin(in_RDI);
    pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::
    construct<pbrt::Point3<float>,pbrt::Point3<float>const&>
              ((polymorphic_allocator<pbrt::Point3<float>> *)in_RDI,pPVar1 + (long)local_28,in_RDX);
  }
  in_RDI->nStored = (size_t)in_RSI;
  return;
}

Assistant:

InlinedVector(size_t count, const T &value, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(begin() + i, value);
        nStored = count;
    }